

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

int net_udp_recv(NETSOCKET sock,NETADDR *addr,void *data,int maxsize)

{
  ssize_t sVar1;
  int iVar2;
  long in_FS_OFFSET;
  socklen_t fromlen;
  char sockaddrbuf [128];
  socklen_t local_bc;
  sockaddr local_b8 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (sock._0_8_ < 0) {
    iVar2 = 0;
  }
  else {
    local_bc = 0x10;
    sVar1 = recvfrom(sock.ipv4sock,data,(long)maxsize,0,local_b8,&local_bc);
    iVar2 = (int)sVar1;
  }
  if (-1 < sock.ipv6sock && iVar2 < 1) {
    local_bc = 0x1c;
    sVar1 = recvfrom(sock.ipv6sock,data,(long)maxsize,0,local_b8,&local_bc);
    iVar2 = (int)sVar1;
  }
  if (iVar2 < 1) {
    iVar2 = -(uint)(iVar2 != 0);
  }
  else {
    sockaddr_to_netaddr((sockaddr *)local_b8,addr);
    network_stats.recv_packets = network_stats.recv_packets + 1;
    network_stats.recv_bytes = iVar2 + network_stats.recv_bytes;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int net_udp_recv(NETSOCKET sock, NETADDR *addr, void *data, int maxsize)
{
	char sockaddrbuf[128];
	socklen_t fromlen;// = sizeof(sockaddrbuf);
	int bytes = 0;

	if(sock.ipv4sock >= 0)
	{
		fromlen = sizeof(struct sockaddr_in);
		bytes = recvfrom(sock.ipv4sock, (char*)data, maxsize, 0, (struct sockaddr *)&sockaddrbuf, &fromlen);
	}

	if(bytes <= 0 && sock.ipv6sock >= 0)
	{
		fromlen = sizeof(struct sockaddr_in6);
		bytes = recvfrom(sock.ipv6sock, (char*)data, maxsize, 0, (struct sockaddr *)&sockaddrbuf, &fromlen);
	}

	if(bytes > 0)
	{
		sockaddr_to_netaddr((struct sockaddr *)&sockaddrbuf, addr);
		network_stats.recv_bytes += bytes;
		network_stats.recv_packets++;
		return bytes;
	}
	else if(bytes == 0)
		return 0;
	return -1; /* error */
}